

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverPtr.cpp
# Opt level: O3

void Rml::Detail::InitializeObserverPtrPool(void)

{
  undefined1 *puVar1;
  
  if (observer_ptr_data == (undefined1 *)0x0) {
    puVar1 = (undefined1 *)operator_new(0x30);
    *puVar1 = 0;
    *(undefined4 *)(puVar1 + 0x2c) = 0;
    puVar1[0xc] = 1;
    *(undefined8 *)(puVar1 + 0x10) = 0;
    *(undefined8 *)(puVar1 + 0x18) = 0;
    *(undefined8 *)(puVar1 + 0x1c) = 0;
    *(undefined8 *)(puVar1 + 0x24) = 0;
    *(undefined4 *)(puVar1 + 8) = 0x80;
    Pool<Rml::Detail::ObserverPtrBlock>::CreateChunk
              ((Pool<Rml::Detail::ObserverPtrBlock> *)(puVar1 + 8));
    observer_ptr_data = puVar1;
  }
  *observer_ptr_data = 0;
  return;
}

Assistant:

void Detail::InitializeObserverPtrPool()
{
	if (!observer_ptr_data)
		observer_ptr_data = new ObserverPtrData;
	observer_ptr_data->is_shutdown = false;
}